

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O2

int slu_mmdupd_(int_t *ehead,int *neqns,int_t *xadj,shortint *adjncy,int_t *delta,int_t *mdeg,
               shortint *dhead,int *dforw,int *dbakw,shortint *qsize,shortint *llist,
               shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int local_5c;
  uint local_58;
  
  iVar1 = *delta;
  iVar2 = *mdeg;
LAB_0010d305:
  iVar3 = *ehead;
  uVar11 = (ulong)iVar3;
  if ((long)uVar11 < 1) {
    return 0;
  }
  iVar16 = *tag + iVar1 + iVar2;
  if (*maxint <= iVar16) {
    *tag = 1;
    uVar9 = (ulong)(uint)*neqns;
    if (*neqns < 1) {
      uVar9 = 0;
    }
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      if (marker[uVar12] < *maxint) {
        marker[uVar12] = 0;
      }
    }
    iVar16 = *tag + iVar1 + iVar2;
  }
  uVar9 = 0;
  local_58 = 0;
  local_5c = 0;
  uVar12 = uVar11;
  do {
    lVar10 = (long)xadj[(long)(int)uVar12 + -1];
    iVar8 = xadj[(int)uVar12];
    while( true ) {
      uVar14 = (uint)uVar9;
      if (iVar8 <= lVar10) goto LAB_0010d40c;
      uVar15 = adjncy[lVar10 + -1];
      lVar13 = (long)(int)uVar15;
      if (lVar13 < 0) break;
      if (uVar15 == 0) goto LAB_0010d40c;
      if (qsize[lVar13 + -1] != 0) {
        local_5c = qsize[lVar13 + -1] + local_5c;
        marker[lVar13 + -1] = iVar16;
        if (dbakw[lVar13 + -1] == 0) {
          if (dforw[lVar13 + -1] == 2) {
            uVar9 = (ulong)uVar15;
            uVar15 = local_58;
            local_58 = uVar14;
          }
          llist[lVar13 + -1] = local_58;
          local_58 = uVar15;
        }
      }
      lVar10 = lVar10 + 1;
    }
    uVar12 = (ulong)-uVar15;
  } while( true );
LAB_0010d40c:
  uVar15 = (uint)uVar9;
  uVar14 = local_58;
  if ((int)uVar15 < 1) goto LAB_0010d526;
  if (dbakw[uVar9 - 1] == 0) {
    *tag = *tag + 1;
    iVar8 = adjncy[(long)xadj[uVar9 - 1] + -1];
    if (iVar8 == iVar3) {
      iVar8 = adjncy[xadj[uVar9 - 1]];
    }
    if (-1 < dforw[(long)iVar8 + -1]) {
      iVar7 = qsize[(long)iVar8 + -1] + local_5c;
      goto LAB_0010d456;
    }
    iVar7 = local_5c;
    goto LAB_0010d46e;
  }
  bVar6 = true;
  while( true ) {
    uVar14 = llist[uVar9 - 1];
    uVar9 = (ulong)uVar14;
    if (bVar6) break;
LAB_0010d526:
    if ((int)uVar14 < 1) {
      *tag = iVar16;
      ehead = llist + (uVar11 - 1);
      goto LAB_0010d305;
    }
    uVar9 = (ulong)uVar14;
    bVar6 = false;
    if (dbakw[uVar9 - 1] == 0) {
      *tag = *tag + 1;
      lVar10 = (long)xadj[uVar9 - 1];
      iVar8 = xadj[uVar9];
      iVar7 = local_5c;
      while ((bVar6 = false, lVar10 < iVar8 && (uVar12 = (ulong)adjncy[lVar10 + -1], uVar12 != 0)))
      {
        if (marker[uVar12 - 1] < *tag) {
          marker[uVar12 - 1] = *tag;
          if (dforw[uVar12 - 1] < 0) {
            do {
              lVar13 = (long)xadj[(long)(int)uVar12 + -1];
              iVar4 = xadj[(int)uVar12];
              while( true ) {
                if (iVar4 <= lVar13) goto LAB_0010d5c2;
                iVar5 = adjncy[lVar13 + -1];
                lVar17 = (long)iVar5;
                if (lVar17 < 0) break;
                if (iVar5 == 0) goto LAB_0010d5c2;
                if (marker[lVar17 + -1] < *tag) {
                  marker[lVar17 + -1] = *tag;
                  iVar7 = iVar7 + qsize[lVar17 + -1];
                }
                lVar13 = lVar13 + 1;
              }
              uVar12 = (ulong)(uint)-iVar5;
            } while( true );
          }
          iVar7 = iVar7 + qsize[uVar12 - 1];
        }
LAB_0010d5c2:
        lVar10 = lVar10 + 1;
      }
LAB_0010d5ca:
      lVar10 = (long)iVar7 - (long)qsize[uVar9 - 1];
      iVar7 = (uint)lVar10 + 1;
      iVar8 = dhead[lVar10];
      dforw[uVar9 - 1] = iVar8;
      dbakw[uVar9 - 1] = ~(uint)lVar10;
      if (0 < (long)iVar8) {
        dbakw[(long)iVar8 + -1] = uVar14;
      }
      dhead[lVar10] = uVar14;
      if (iVar7 < *mdeg) {
        *mdeg = iVar7;
      }
    }
  }
  goto LAB_0010d40c;
LAB_0010d46e:
  lVar10 = (long)xadj[(long)iVar8 + -1];
  iVar8 = xadj[iVar8];
  do {
    if (iVar8 <= lVar10) {
LAB_0010d456:
      bVar6 = true;
      uVar14 = uVar15;
      goto LAB_0010d5ca;
    }
    uVar14 = adjncy[lVar10 + -1];
    uVar12 = (ulong)uVar14;
    if (uVar14 != uVar15) {
      if ((int)uVar14 < 0) break;
      if (uVar12 == 0) goto LAB_0010d456;
      if (qsize[uVar12 - 1] != 0) {
        if (marker[uVar12 - 1] < *tag) {
          marker[uVar12 - 1] = *tag;
          iVar7 = iVar7 + qsize[uVar12 - 1];
        }
        else if (dbakw[uVar12 - 1] == 0) {
          if (dforw[uVar12 - 1] == 2) {
            qsize[uVar9 - 1] = qsize[uVar9 - 1] + qsize[uVar12 - 1];
            qsize[uVar12 - 1] = 0;
            marker[uVar12 - 1] = *maxint;
            dforw[uVar12 - 1] = -uVar15;
          }
          dbakw[uVar12 - 1] = -*maxint;
        }
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
  iVar8 = -uVar14;
  goto LAB_0010d46e;
}

Assistant:

int slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt, 
	    istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
	return 0;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
	goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	enode = adjncy[i];
	link = -enode;
	if (enode < 0) {
	    goto L400;
	} else if (enode == 0) {
	    goto L800;
	} else {
	    goto L500;
	}

L500:
	if (qsize[enode] == 0) {
	    goto L700;
	}
	deg0 += qsize[enode];
	marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
	if (dbakw[enode] != 0) {
	    goto L700;
	}
/*                            --------------------------------------- 
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS. 
*/
/*                            --------------------------------------- 
*/
	if (dforw[enode] == 2) {
	    goto L600;
	}
	llist[enode] = qxhead;
	qxhead = enode;
	goto L700;
L600:
	llist[enode] = q2head;
	q2head = enode;
L700:
	;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
	goto L1500;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
	nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
	goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	node = adjncy[i];
	link = -node;
	if (node == enode) {
	    goto L1400;
	}
	if (node < 0) {
	    goto L1000;
	} else if (node == 0) {
	    goto L2100;
	} else {
	    goto L1100;
	}

L1100:
	if (qsize[node] == 0) {
	    goto L1400;
	}
	if (marker[node] >= *tag) {
	    goto L1200;
	}
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
	marker[node] = *tag;
	deg += qsize[node];
	goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
	if (dbakw[node] != 0) {
	    goto L1400;
	}
	if (dforw[node] != 2) {
	    goto L1300;
	}
	qsize[enode] += qsize[node];
	qsize[node] = 0;
	marker[node] = *maxint;
	dforw[node] = -enode;
	dbakw[node] = -(*maxint);
	goto L1400;
L1300:
/*                            -------------------------------------- 
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE. 
*/
/*                            -------------------------------------- 
*/
	if (dbakw[node] == 0) {
	    dbakw[node] = -(*maxint);
	}
L1400:
	;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
	goto L2300;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L2100;
	}
	if (marker[nabor] >= *tag) {
	    goto L2000;
	}
	marker[nabor] = *tag;
	link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
	if (dforw[nabor] < 0) {
	    goto L1700;
	}
	deg += qsize[nabor];
	goto L2000;
L1700:
/*                                    ------------------------------- 
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED 
*/
/*                                    NODES IN THIS ELEMENT INTO THE 
*/
/*                                    DEGREE COUNT. */
/*                                    ------------------------------- 
*/
	jstrt = xadj[link];
	jstop = xadj[link + 1] - 1;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    node = adjncy[j];
	    link = -node;
	    if (node < 0) {
		goto L1700;
	    } else if (node == 0) {
		goto L2000;
	    } else {
		goto L1800;
	    }

L1800:
	    if (marker[node] >= *tag) {
		goto L1900;
	    }
	    marker[node] = *tag;
	    deg += qsize[node];
L1900:
	    ;
	}
L2000:
	;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
	dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
	*mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
	goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}